

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment4Driver.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Game game;
  Game GStack_108;
  
  Game::Game(&GStack_108);
  Game::init_game_dependencies(&GStack_108);
  Game::init_game_loop(&GStack_108);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Game is over. Thanks for playing",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  Game::~Game(&GStack_108);
  return 0;
}

Assistant:

int main(int argc, const char * argv[]) {
    Game game;
    // Choose all computers if you want to have tournament of comps playing against each other
    game.init_game_dependencies();
    game.init_game_loop();
    cout << "Game is over. Thanks for playing" << endl;
    return 0;
}